

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall
boost::runtime::option::
option<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>
          (option *this,cstring *name,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
          *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  iterator pvVar4;
  ref_type pbVar5;
  ref_type pbVar6;
  res_type pbVar7;
  size_t sVar8;
  ref_type pbVar9;
  ref_type pbVar10;
  cstring *value_separator;
  undefined1 local_202 [2];
  string *local_200;
  string *local_1f8;
  basic_cstring<const_char> *local_1f0;
  param_cla_ids *local_1e8;
  callback_type *local_1e0;
  string *local_1d8;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
  *local_1d0;
  iterator local_1c8;
  ref_type local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [8];
  iterator pvStack_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined1 local_178 [32];
  basic_cstring<const_char> local_158;
  basic_cstring<const_char> local_148;
  type local_138;
  cstring local_e8;
  undefined1 local_d0 [48];
  cstring local_a0;
  function1<void,_boost::unit_test::basic_cstring<const_char>_> local_90;
  type local_70;
  
  pbVar9 = (ref_type)name->m_begin;
  pvVar4 = name->m_end;
  local_d0._16_8_ = local_202 + 1;
  local_202[1] = 1;
  local_d0[0x18] = false;
  local_1d0 = m;
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>>
            (&local_70,(nfp *)m,
             (named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
              *)(local_d0 + 0x10),
             (named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>
              *)m);
  local_d0._0_8_ = local_202;
  local_202[0] = 0;
  local_d0[8] = false;
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>>
            (&local_138,(nfp *)&local_70,
             (named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
              *)local_d0,
             (named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>
              *)m);
  (this->super_basic_param)._vptr_basic_param = (_func_int **)&PTR__basic_param_001e0df0;
  local_1d8 = &(this->super_basic_param).p_name;
  (this->super_basic_param).p_name._M_dataplus._M_p =
       (pointer)&(this->super_basic_param).p_name.field_2;
  local_1c8 = pvVar4;
  local_1c0 = pbVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,pbVar9,pvVar4);
  pcVar3 = local_178 + 0x10;
  local_178._8_8_ = 0;
  local_178[0x10] = '\0';
  local_178._0_8_ = pcVar3;
  pbVar5 = nfp::
           named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
           ::operator[]((named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
                         *)&local_138);
  local_198 = (undefined1  [8])pbVar5->m_begin;
  pvStack_190 = pbVar5->m_end;
  unit_test::assign_op<char,char_const>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
             (basic_cstring<const_char> *)local_198,0);
  local_1f8 = &(this->super_basic_param).p_description;
  paVar1 = &(this->super_basic_param).p_description.field_2;
  (this->super_basic_param).p_description._M_dataplus._M_p = (pointer)paVar1;
  if ((pointer)local_178._0_8_ == pcVar3) {
    paVar1->_M_allocated_capacity = CONCAT71(local_178._17_7_,local_178[0x10]);
    *(undefined8 *)((long)&(this->super_basic_param).p_description.field_2 + 8) = local_178._24_8_;
  }
  else {
    (local_1f8->_M_dataplus)._M_p = (pointer)local_178._0_8_;
    paVar1->_M_allocated_capacity = CONCAT71(local_178._17_7_,local_178[0x10]);
  }
  (this->super_basic_param).p_description._M_string_length = local_178._8_8_;
  local_178._8_8_ = 0;
  local_178[0x10] = '\0';
  local_1f0 = (basic_cstring<const_char> *)local_198;
  local_178._0_8_ = pcVar3;
  std::__cxx11::string::~string((string *)local_178);
  pvStack_190 = (iterator)0x0;
  local_188._M_local_buf[0] = '\0';
  local_198 = (undefined1  [8])&local_188;
  pbVar6 = nfp::
           named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>
           ::operator[](&local_138.
                         super_named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
                         .
                         super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
                         .m_param);
  local_1b8._M_dataplus._M_p = pbVar6->m_begin;
  local_1b8._M_string_length = (size_type)pbVar6->m_end;
  unit_test::assign_op<char,char_const>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (basic_cstring<const_char> *)&local_1b8,0);
  local_1f0 = (basic_cstring<const_char> *)&(this->super_basic_param).p_help;
  paVar1 = &(this->super_basic_param).p_help.field_2;
  (this->super_basic_param).p_help._M_dataplus._M_p = (pointer)paVar1;
  if (local_198 == (undefined1  [8])&local_188) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
    *(undefined8 *)((long)&(this->super_basic_param).p_help.field_2 + 8) = local_188._8_8_;
  }
  else {
    (((string *)local_1f0)->_M_dataplus)._M_p = (pointer)local_198;
    paVar1->_M_allocated_capacity =
         CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
  }
  (this->super_basic_param).p_help._M_string_length = (size_type)pvStack_190;
  pvStack_190 = (iterator)0x0;
  local_188._M_local_buf[0] = '\0';
  local_198 = (undefined1  [8])&local_188;
  std::__cxx11::string::~string((string *)local_198);
  paVar2 = &local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p = (pointer)paVar2;
  pbVar7 = nfp::
           named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
           ::operator[]((named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
                         *)&local_138);
  local_158.m_begin = pbVar7->m_begin;
  local_158.m_end = pbVar7->m_end;
  unit_test::assign_op<char,char_const>
            (&local_1b8,(basic_cstring<const_char> *)(local_178 + 0x20),0);
  local_200 = &(this->super_basic_param).p_env_var;
  paVar1 = &(this->super_basic_param).p_env_var.field_2;
  (this->super_basic_param).p_env_var._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,local_1b8.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->super_basic_param).p_env_var.field_2 + 8) =
         local_1b8.field_2._8_8_;
  }
  else {
    (local_200->_M_dataplus)._M_p = local_1b8._M_dataplus._M_p;
    paVar1->_M_allocated_capacity =
         CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,local_1b8.field_2._M_local_buf[0]);
  }
  (this->super_basic_param).p_env_var._M_string_length = local_1b8._M_string_length;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::~string((string *)&local_1b8);
  local_158.m_begin = (iterator)&local_148;
  (this->super_basic_param).p_value_hint._M_dataplus._M_p =
       (pointer)&(this->super_basic_param).p_value_hint.field_2;
  (this->super_basic_param).p_value_hint.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 1) = local_148._1_8_;
  *(undefined4 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 9) = local_148.m_end._1_4_
  ;
  *(undefined2 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 0xd) =
       local_148.m_end._5_2_;
  (this->super_basic_param).p_value_hint.field_2._M_local_buf[0xf] = local_148.m_end._7_1_;
  (this->super_basic_param).p_value_hint._M_string_length = 0;
  local_158.m_end = (iterator)0x0;
  local_148.m_begin._0_1_ = 0;
  std::__cxx11::string::~string((string *)(local_178 + 0x20));
  (this->super_basic_param).p_optional = true;
  (this->super_basic_param).p_repeatable = false;
  (this->super_basic_param).p_has_optional_value.super_class_property<bool>.value =
       (bool)(local_138.
              super_named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
              .m_param.m_erased ^ 1);
  (this->super_basic_param).p_has_default_value.super_class_property<bool>.value =
       (bool)(local_138.m_param.m_erased ^ 1);
  local_1e0 = &(this->super_basic_param).p_callback;
  local_90.super_function_base.vtable = (vtable_base *)0x0;
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::function1
            (&local_1e0->super_function1<void,_boost::unit_test::basic_cstring<const_char>_>,
             &local_90);
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::~function1(&local_90);
  local_1e8 = &(this->super_basic_param).m_cla_ids;
  (this->super_basic_param).m_cla_ids.
  super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_basic_param).m_cla_ids.
  super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_basic_param).m_cla_ids.
  super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.m_begin = (iterator)help_prefix._0_8_;
  local_e8.m_end = (iterator)help_prefix._8_8_;
  local_a0.m_begin = local_1c0;
  local_a0.m_end = local_1c8;
  value_separator = (cstring *)(local_d0 + 0x20);
  local_d0._32_8_ = ":";
  sVar8 = unit_test::ut_detail::bcs_char_traits_impl<const_char>::length(":");
  local_d0._40_8_ = "MESSAGE:" + sVar8 + 7;
  basic_param::add_cla_id(&this->super_basic_param,&local_e8,&local_a0,value_separator);
  (this->super_basic_param)._vptr_basic_param = (_func_int **)&PTR__basic_param_001e0d70;
  local_1b8._M_dataplus._M_p._0_1_ = 1;
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &local_1b8;
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>>
            (&local_70,(nfp *)local_1d0,
             (named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
              *)local_178,
             (named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>
              *)value_separator);
  local_158.m_begin = (iterator)((ulong)local_158.m_begin & 0xffffffffffffff00);
  local_198 = (undefined1  [8])(local_178 + 0x20);
  pvStack_190 = (iterator)((ulong)pvStack_190 & 0xffffffffffffff00);
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>>
            (&local_138,(nfp *)&local_70,
             (named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
              *)local_198,
             (named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>
              *)value_separator);
  pbVar9 = nfp::
           named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>
           ::operator[](&local_138.
                         super_named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
                         .m_param);
  (this->m_arg_factory).m_optional_value = *pbVar9;
  pbVar10 = nfp::
            named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>
            ::operator[](&local_138.m_param);
  (this->m_arg_factory).m_default_value = *pbVar10;
  return;
}

Assistant:

option( cstring name, Modifiers const& m )
#endif
    : basic_param( name, true, false, nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    , m_arg_factory( nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    {
    }